

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator * __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
::operator()(iterator *__return_storage_ptr__,
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
            *this,basic_string_view<wchar_t> value)

{
  wchar_t *pwVar1;
  size_t sVar2;
  value_type_conflict vVar3;
  undefined4 uVar4;
  error_handler local_21;
  
  if (this->specs_ == (format_specs *)0x0) {
    basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
    ::write(&this->writer_,(int)value.data_,(void *)value.size_,(size_t)value.size_);
  }
  else {
    check_string_type_spec<char,fmt::v5::internal::error_handler>
              ((this->specs_->super_core_format_specs).type,&local_21);
    basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
    ::write<wchar_t>(&this->writer_,value,this->specs_);
  }
  pwVar1 = (this->writer_).out_.super_truncating_iterator_base<wchar_t_*>.out_;
  sVar2 = (this->writer_).out_.super_truncating_iterator_base<wchar_t_*>.limit_;
  vVar3 = (this->writer_).out_.blackhole_;
  uVar4 = *(undefined4 *)&(this->writer_).out_.field_0x1c;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).count_ =
       (this->writer_).out_.super_truncating_iterator_base<wchar_t_*>.count_;
  __return_storage_ptr__->blackhole_ = vVar3;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar4;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar1;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).limit_ = sVar2;
  return __return_storage_ptr__;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }